

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtHelper.cpp
# Opt level: O3

void __thiscall
JsrtCallbackState::JsrtCallbackState(JsrtCallbackState *this,ThreadContext *currentThreadContext)

{
  code *pcVar1;
  bool bVar2;
  JsrtContext *pJVar3;
  undefined4 *puVar4;
  
  if (currentThreadContext == (ThreadContext *)0x0) {
    currentThreadContext = ThreadContext::GetContextForCurrentThread();
  }
  this->originalThreadContext = currentThreadContext;
  pJVar3 = JsrtContext::GetCurrent();
  this->originalJsrtContext = pJVar3;
  if ((pJVar3 != (JsrtContext *)0x0) &&
     (this->originalThreadContext !=
      ((((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
      threadContext)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtHelper.cpp"
                       ,0x36,
                       "(originalJsrtContext == nullptr || originalThreadContext == originalJsrtContext->GetScriptContext()->GetThreadContext())"
                       ,
                       "originalJsrtContext == nullptr || originalThreadContext == originalJsrtContext->GetScriptContext()->GetThreadContext()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

JsrtCallbackState::JsrtCallbackState(ThreadContext* currentThreadContext)
{
    if (currentThreadContext == nullptr)
    {
        originalThreadContext = ThreadContext::GetContextForCurrentThread();
    }
    else
    {
        originalThreadContext = currentThreadContext;
    }
    originalJsrtContext = JsrtContext::GetCurrent();
    Assert(originalJsrtContext == nullptr || originalThreadContext == originalJsrtContext->GetScriptContext()->GetThreadContext());
}